

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rep_test.c
# Opt level: O0

void test_rep_ctx_send_nonblock2(void)

{
  int iVar1;
  nng_err nVar2;
  char *pcVar3;
  nng_msg *pnVar4;
  char *pcVar5;
  bool bVar6;
  nng_err result__14;
  nng_err result__13;
  int i_4;
  nng_err result__12;
  int rv;
  int i_3;
  nng_err result__11;
  nng_msg *msg_1;
  int i_2;
  nng_err result__10;
  nng_err result__9;
  nng_err result__8;
  nng_msg *msg;
  int i_1;
  nng_err result__7;
  nng_err result__6;
  nng_err result__5;
  int i;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  int num_fail;
  int num_good;
  nng_aio *rep_aio [10];
  nng_ctx rep_ctx [10];
  nng_socket req;
  nng_socket rep;
  
  result_ = NNG_OK;
  result__1 = NNG_OK;
  result__2 = nng_req0_open_raw((nng_socket *)(rep_ctx + 8));
  bVar6 = result__2 == NNG_OK;
  pcVar3 = nng_strerror(result__2);
  iVar1 = acutest_check_((uint)bVar6,
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                         ,0x29b,"%s: expected success, got %s (%d)","nng_req0_open_raw(&req)",pcVar3
                         ,result__2);
  if (iVar1 == 0) {
    acutest_abort_();
  }
  result__3 = nng_rep0_open((nng_socket *)(rep_ctx + 9));
  bVar6 = result__3 == NNG_OK;
  pcVar3 = nng_strerror(result__3);
  iVar1 = acutest_check_((uint)bVar6,
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                         ,0x29c,"%s: expected success, got %s (%d)","nng_rep0_open(&rep)",pcVar3,
                         result__3);
  if (iVar1 == 0) {
    acutest_abort_();
  }
  result__4 = nng_socket_set_ms((nng_socket)rep_ctx[8].id,"send-timeout",1000);
  bVar6 = result__4 == NNG_OK;
  pcVar3 = nng_strerror(result__4);
  iVar1 = acutest_check_((uint)bVar6,
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                         ,0x29d,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(req, NNG_OPT_SENDTIMEO, 1000)",pcVar3,result__4);
  if (iVar1 == 0) {
    acutest_abort_();
  }
  i = nng_socket_set_ms((nng_socket)rep_ctx[9].id,"recv-timeout",1000);
  bVar6 = i == NNG_OK;
  pcVar3 = nng_strerror(i);
  iVar1 = acutest_check_((uint)bVar6,
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                         ,0x29e,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(rep, NNG_OPT_RECVTIMEO, 1000)",pcVar3,i);
  if (iVar1 == 0) {
    acutest_abort_();
  }
  result__5 = nng_socket_set_ms((nng_socket)rep_ctx[9].id,"send-timeout",1000);
  bVar6 = result__5 == NNG_OK;
  pcVar3 = nng_strerror(result__5);
  iVar1 = acutest_check_((uint)bVar6,
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                         ,0x29f,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(rep, NNG_OPT_SENDTIMEO, 1000)",pcVar3,result__5);
  if (iVar1 == 0) {
    acutest_abort_();
  }
  result__6 = NNG_OK;
  while( true ) {
    if (9 < (int)result__6) {
      msg._4_4_ = nuts_marry((nng_socket)rep_ctx[8].id,(nng_socket)rep_ctx[9].id);
      bVar6 = msg._4_4_ == NNG_OK;
      pcVar3 = nng_strerror(msg._4_4_);
      iVar1 = acutest_check_((uint)bVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                             ,0x2a4,"%s: expected success, got %s (%d)","nuts_marry(req, rep)",
                             pcVar3,msg._4_4_);
      if (iVar1 == 0) {
        acutest_abort_();
      }
      msg._0_4_ = 0;
      while( true ) {
        if (9 < (int)(uint)msg) {
          for (msg_1._0_4_ = 0; (int)msg_1 < 10; msg_1._0_4_ = (int)msg_1 + 1) {
            nng_aio_wait(*(nng_aio **)(&num_fail + (long)(int)msg_1 * 2));
            nVar2 = nng_aio_result(*(nng_aio **)(&num_fail + (long)(int)msg_1 * 2));
            pcVar3 = nng_strerror(nVar2);
            iVar1 = acutest_check_((uint)(nVar2 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                                   ,0x2b0,"%s: expected success, got %s (%d)",
                                   "nng_aio_result(rep_aio[i])",pcVar3,nVar2);
            if (iVar1 == 0) {
              acutest_abort_();
            }
            pnVar4 = nng_aio_get_msg(*(nng_aio **)(&num_fail + (long)(int)msg_1 * 2));
            nng_aio_set_timeout(*(nng_aio **)(&num_fail + (long)(int)msg_1 * 2),0);
            nng_aio_set_msg(*(nng_aio **)(&num_fail + (long)(int)msg_1 * 2),pnVar4);
            nng_ctx_send((nng_ctx)rep_ctx[(long)(int)msg_1 + -2].id,
                         *(nng_aio **)(&num_fail + (long)(int)msg_1 * 2));
          }
          for (result__12 = NNG_OK; (int)result__12 < 10; result__12 = result__12 + NNG_EINTR) {
            nng_aio_wait(*(nng_aio **)(&num_fail + (long)(int)result__12 * 2));
            nVar2 = nng_aio_result(*(nng_aio **)(&num_fail + (long)(int)result__12 * 2));
            if (nVar2 == NNG_OK) {
              result_ = result_ + NNG_EINTR;
            }
            else {
              pcVar3 = nng_strerror(NNG_ETIMEDOUT);
              acutest_check_((uint)(nVar2 == NNG_ETIMEDOUT),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                             ,0x2be,"%s fails with %s","rv",pcVar3);
              pcVar3 = nng_strerror(NNG_ETIMEDOUT);
              pcVar5 = nng_strerror(nVar2);
              acutest_message_("%s: expected %s (%d), got %s (%d)","rv",pcVar3,5,pcVar5,(ulong)nVar2
                              );
              pnVar4 = nng_aio_get_msg(*(nng_aio **)(&num_fail + (long)(int)result__12 * 2));
              nng_msg_free(pnVar4);
              result__1 = result__1 + NNG_EINTR;
            }
          }
          iVar1 = acutest_check_((uint)(0 < (int)result_),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                                 ,0x2c4,"%s","num_good > 0");
          if (iVar1 == 0) {
            acutest_abort_();
          }
          iVar1 = acutest_check_((uint)(0 < (int)result__1),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                                 ,0x2c5,"%s","num_fail > 0");
          if (iVar1 == 0) {
            acutest_abort_();
          }
          for (result__14 = NNG_OK; (int)result__14 < 10; result__14 = result__14 + NNG_EINTR) {
            nng_aio_free(*(nng_aio **)(&num_fail + (long)(int)result__14 * 2));
            nng_ctx_close((nng_ctx)rep_ctx[(long)(int)result__14 + -2].id);
          }
          nVar2 = nng_socket_close((nng_socket)rep_ctx[9].id);
          pcVar3 = nng_strerror(nVar2);
          iVar1 = acutest_check_((uint)(nVar2 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                                 ,0x2cb,"%s: expected success, got %s (%d)","nng_socket_close(rep)",
                                 pcVar3,nVar2);
          if (iVar1 == 0) {
            acutest_abort_();
          }
          nVar2 = nng_socket_close((nng_socket)rep_ctx[8].id);
          pcVar3 = nng_strerror(nVar2);
          iVar1 = acutest_check_((uint)(nVar2 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                                 ,0x2cc,"%s: expected success, got %s (%d)","nng_socket_close(req)",
                                 pcVar3,nVar2);
          if (iVar1 == 0) {
            acutest_abort_();
          }
          return;
        }
        nVar2 = nng_msg_alloc((nng_msg **)&result__9,4);
        pcVar3 = nng_strerror(nVar2);
        iVar1 = acutest_check_((uint)(nVar2 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                               ,0x2a8,"%s: expected success, got %s (%d)","nng_msg_alloc(&msg, 4)",
                               pcVar3,nVar2);
        if (iVar1 == 0) {
          acutest_abort_();
        }
        nVar2 = nng_msg_append_u32(_result__9,(uint)msg | 0x80000000);
        pcVar3 = nng_strerror(nVar2);
        iVar1 = acutest_check_((uint)(nVar2 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                               ,0x2a9,"%s: expected success, got %s (%d)",
                               "nng_msg_append_u32(msg, (unsigned) i | 0x80000000u)",pcVar3,nVar2);
        if (iVar1 == 0) break;
        nng_ctx_recv((nng_ctx)rep_ctx[(long)(int)(uint)msg + -2].id,
                     *(nng_aio **)(&num_fail + (long)(int)(uint)msg * 2));
        nVar2 = nng_sendmsg((nng_socket)rep_ctx[8].id,_result__9,0);
        pcVar3 = nng_strerror(nVar2);
        iVar1 = acutest_check_((uint)(nVar2 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                               ,0x2ab,"%s: expected success, got %s (%d)","nng_sendmsg(req, msg, 0)"
                               ,pcVar3,nVar2);
        if (iVar1 == 0) {
          acutest_abort_();
        }
        msg._0_4_ = (uint)msg + 1;
      }
      acutest_abort_();
    }
    result__7 = nng_ctx_open(rep_ctx + (long)(int)result__6 + -2,(nng_socket)rep_ctx[9].id);
    bVar6 = result__7 == NNG_OK;
    pcVar3 = nng_strerror(result__7);
    iVar1 = acutest_check_((uint)bVar6,
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                           ,0x2a1,"%s: expected success, got %s (%d)",
                           "nng_ctx_open(&rep_ctx[i], rep)",pcVar3,result__7);
    if (iVar1 == 0) {
      acutest_abort_();
    }
    i_1 = nng_aio_alloc((nng_aio **)(&num_fail + (long)(int)result__6 * 2),
                        (_func_void_void_ptr *)0x0,(void *)0x0);
    bVar6 = i_1 == NNG_OK;
    pcVar3 = nng_strerror(i_1);
    iVar1 = acutest_check_((uint)bVar6,
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                           ,0x2a2,"%s: expected success, got %s (%d)",
                           "nng_aio_alloc(&rep_aio[i], NULL, NULL)",pcVar3,i_1);
    if (iVar1 == 0) break;
    result__6 = result__6 + NNG_EINTR;
  }
  acutest_abort_();
}

Assistant:

static void
test_rep_ctx_send_nonblock2(void)
{
	nng_socket rep;
	nng_socket req;
	nng_ctx    rep_ctx[10];
	nng_aio   *rep_aio[10];
	int        num_good = 0;
	int        num_fail = 0;

	// We are going to send a bunch of requests, receive them,
	// but then see that non-block pressure exerts for some, but
	// that at least one non-blocking send works.
	NUTS_PASS(nng_req0_open_raw(&req));
	NUTS_PASS(nng_rep0_open(&rep));
	NUTS_PASS(nng_socket_set_ms(req, NNG_OPT_SENDTIMEO, 1000));
	NUTS_PASS(nng_socket_set_ms(rep, NNG_OPT_RECVTIMEO, 1000));
	NUTS_PASS(nng_socket_set_ms(rep, NNG_OPT_SENDTIMEO, 1000));
	for (int i = 0; i < 10; i++) {
		NUTS_PASS(nng_ctx_open(&rep_ctx[i], rep));
		NUTS_PASS(nng_aio_alloc(&rep_aio[i], NULL, NULL));
	}
	NUTS_MARRY(req, rep);

	for (int i = 0; i < 10; i++) {
		nng_msg *msg;
		NUTS_PASS(nng_msg_alloc(&msg, 4));
		NUTS_PASS(nng_msg_append_u32(msg, (unsigned) i | 0x80000000u));
		nng_ctx_recv(rep_ctx[i], rep_aio[i]);
		NUTS_PASS(nng_sendmsg(req, msg, 0));
	}
	for (int i = 0; i < 10; i++) {
		nng_msg *msg;
		nng_aio_wait(rep_aio[i]);
		NUTS_PASS(nng_aio_result(rep_aio[i]));
		msg = nng_aio_get_msg(rep_aio[i]);
		nng_aio_set_timeout(rep_aio[i], 0);
		nng_aio_set_msg(rep_aio[i], msg);
		nng_ctx_send(rep_ctx[i], rep_aio[i]);
	}

	for (int i = 0; i < 10; i++) {
		int rv;
		nng_aio_wait(rep_aio[i]);
		rv = nng_aio_result(rep_aio[i]);
		if (rv == 0) {
			num_good++;
		} else {
			NUTS_FAIL(rv, NNG_ETIMEDOUT);
			nng_msg_free(nng_aio_get_msg(rep_aio[i]));
			num_fail++;
		}
	}

	TEST_ASSERT(num_good > 0);
	TEST_ASSERT(num_fail > 0);

	for (int i = 0; i < 10; i++) {
		nng_aio_free(rep_aio[i]);
		nng_ctx_close(rep_ctx[i]);
	}
	NUTS_CLOSE(rep);
	NUTS_CLOSE(req);
}